

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

void prev_level(boolean at_stairs)

{
  d_level newlevel;
  d_level local_2;
  
  if (((at_stairs == '\0') || (u.ux != (level->sstairs).sx)) || (u.uy != (level->sstairs).sy)) {
    goto_level(&local_2,at_stairs,'\0','\0');
    return;
  }
  if (((u.uz.dnum == '\0') && (u.uz.dlevel == '\x01')) && ((u.uhave._0_1_ & 1) == 0)) {
    done(0xf);
    return;
  }
  goto_level(&(level->sstairs).tolev,at_stairs,'\0','\0');
  return;
}

Assistant:

void prev_level(boolean at_stairs)
{
	if (at_stairs && u.ux == level->sstairs.sx && u.uy == level->sstairs.sy) {
		/* Taking an up dungeon branch. */
		/* KMH -- Upwards branches are okay if not level 1 */
		/* (Just make sure it doesn't go above depth 1) */
		if (!u.uz.dnum && u.uz.dlevel == 1 && !u.uhave.amulet)
		    done(ESCAPED);
		else goto_level(&level->sstairs.tolev, at_stairs, FALSE, FALSE);
	} else {
		/* Going up a stairs or rising through the ceiling. */
		d_level	newlevel;
		newlevel.dnum = u.uz.dnum;
		newlevel.dlevel = u.uz.dlevel - 1;
		goto_level(&newlevel, at_stairs, FALSE, FALSE);
	}
}